

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_db_release_memory(sqlite3 *db)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  lVar2 = 8;
  for (lVar3 = 0; lVar3 < db->nDb; lVar3 = lVar3 + 1) {
    lVar1 = *(long *)((long)&db->aDb->zDbSName + lVar2);
    if (lVar1 != 0) {
      (*sqlite3Config.pcache2.xShrink)
                (*(sqlite3_pcache **)(*(long *)(**(long **)(lVar1 + 8) + 0x120) + 0x40));
    }
    lVar2 = lVar2 + 0x20;
  }
  sqlite3BtreeLeaveAll(db);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_db_release_memory(sqlite3 *db){
  int i;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  for(i=0; i<db->nDb; i++){
    Btree *pBt = db->aDb[i].pBt;
    if( pBt ){
      Pager *pPager = sqlite3BtreePager(pBt);
      sqlite3PagerShrink(pPager);
    }
  }
  sqlite3BtreeLeaveAll(db);
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}